

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O2

CURLcode mqtt_do(connectdata *conn,_Bool *done)

{
  Curl_easy *data;
  CURLcode CVar1;
  char local_58 [14];
  undefined2 uStack_4a;
  undefined6 uStack_48;
  undefined2 uStack_42;
  undefined2 uStack_40;
  undefined6 uStack_3e;
  char client_id [13];
  
  data = conn->data;
  *done = false;
  client_id[8] = '\0';
  client_id[9] = '\0';
  client_id[10] = '\0';
  client_id[0xb] = '\0';
  client_id[0xc] = '\0';
  builtin_strncpy(client_id,"curl",5);
  client_id[5] = '\0';
  client_id[6] = '\0';
  client_id[7] = '\0';
  local_58[8] = '\x04';
  local_58[9] = '\x02';
  local_58[10] = '\0';
  local_58[0xb] = '<';
  local_58[0xc] = '\0';
  uStack_4a = 0;
  uStack_48 = 0;
  uStack_42 = 0;
  uStack_40 = 0;
  uStack_3e = 0;
  local_58[0] = '\x10';
  local_58[1] = '\x18';
  local_58[2] = '\0';
  local_58[3] = '\x04';
  local_58[4] = 'M';
  local_58[5] = 'Q';
  local_58[6] = 'T';
  local_58[7] = 'T';
  local_58[0xd] = 0xc;
  CVar1 = Curl_rand_hex(data,(uchar *)(client_id + 4),9);
  uStack_4a = (undefined2)client_id._0_5_;
  uStack_48 = (undefined6)(CONCAT35(client_id._5_3_,client_id._0_5_) >> 0x10);
  uStack_42 = (undefined2)client_id._8_4_;
  uStack_40 = SUB42(client_id._8_4_,2);
  Curl_infof(conn->data,"Using client id \'%s\'\n",client_id);
  if ((CVar1 == CURLE_OK) && (CVar1 = mqtt_send(conn,local_58,0x1a), CVar1 == CURLE_OK)) {
    (conn->proto).ftpc.pp.cache = (char *)0x200000000;
    return CURLE_OK;
  }
  Curl_failf(data,"Error %d sending MQTT CONN request",(ulong)CVar1);
  return CVar1;
}

Assistant:

static CURLcode mqtt_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;

  *done = FALSE; /* unconditionally */

  result = mqtt_connect(conn);
  if(result) {
    failf(data, "Error %d sending MQTT CONN request", result);
    return result;
  }
  mqstate(conn, MQTT_FIRST, MQTT_CONNACK);
  return CURLE_OK;
}